

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  ostream *poVar3;
  CopyStatus CVar4;
  mode_t local_48c;
  mode_t local_3f4;
  undefined1 local_3f0 [4];
  mode_t permissions;
  string local_3d0;
  ostringstream local_3b0 [8];
  ostringstream e_1;
  Status local_234;
  Status copy_status_1;
  Status local_224;
  mode_t local_21c;
  undefined1 local_218 [4];
  mode_t perm;
  string local_1f8;
  ostringstream local_1c8 [8];
  ostringstream e;
  Status local_50;
  Kind local_48;
  Status local_40;
  CopyStatus copy_status;
  bool copy;
  string *toFile_local;
  string *fromFile_local;
  cmFileCopier *this_local;
  mode_t mStack_10;
  MatchProperties match_properties_local;
  
  copy_status.super_Status.field_1.POSIX_._3_1_ = 1;
  unique0x1000041f = toFile;
  if (((this->Always & 1U) == 0) &&
     (bVar2 = cmFileTimeCache::DifferS(&this->FileTimes,fromFile,toFile), !bVar2)) {
    copy_status.super_Status.field_1.POSIX_._3_1_ = 0;
  }
  (*this->_vptr_cmFileCopier[5])
            (this,stack0xffffffffffffffd0,0,
             (ulong)(copy_status.super_Status.field_1.POSIX_._3_1_ & 1));
  if ((copy_status.super_Status.field_1.POSIX_._3_1_ & 1) != 0) {
    CVar4 = cmsys::SystemTools::CopyAFile(fromFile,stack0xffffffffffffffd0,true);
    local_50 = CVar4.super_Status;
    local_40 = local_50;
    local_48 = CVar4.Path;
    copy_status.super_Status.Kind_ = local_48;
    bVar2 = cmsys::Status::operator_cast_to_bool(&local_40);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar3 = std::operator<<((ostream *)local_1c8,this->Name);
      poVar3 = std::operator<<(poVar3," cannot copy file \"");
      poVar3 = std::operator<<(poVar3,(string *)fromFile);
      poVar3 = std::operator<<(poVar3,"\" to \"");
      poVar3 = std::operator<<(poVar3,(string *)stack0xffffffffffffffd0);
      poVar3 = std::operator<<(poVar3,"\": ");
      cmsys::Status::GetString_abi_cxx11_(&local_1f8,&local_40);
      poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
      std::operator<<(poVar3,".");
      std::__cxx11::string::~string((string *)&local_1f8);
      pcVar1 = this->Status;
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(pcVar1,(string *)local_218);
      std::__cxx11::string::~string((string *)local_218);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      return false;
    }
  }
  if (((copy_status.super_Status.field_1.POSIX_._3_1_ & 1) != 0) && ((this->Always & 1U) == 0)) {
    local_21c = 0;
    local_224 = cmsys::SystemTools::GetPermissions(stack0xffffffffffffffd0,&local_21c);
    bVar2 = cmsys::Status::operator_cast_to_bool(&local_224);
    if (bVar2) {
      copy_status_1 =
           cmsys::SystemTools::SetPermissions(stack0xffffffffffffffd0,local_21c | 0x80,false);
    }
    local_234 = cmFileTimes::Copy(fromFile,stack0xffffffffffffffd0);
    bVar2 = cmsys::Status::operator_cast_to_bool(&local_234);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_3b0);
      poVar3 = std::operator<<((ostream *)local_3b0,this->Name);
      poVar3 = std::operator<<(poVar3," cannot set modification time on \"");
      poVar3 = std::operator<<(poVar3,(string *)stack0xffffffffffffffd0);
      poVar3 = std::operator<<(poVar3,"\": ");
      cmsys::Status::GetString_abi_cxx11_(&local_3d0,&local_234);
      poVar3 = std::operator<<(poVar3,(string *)&local_3d0);
      std::operator<<(poVar3,".");
      std::__cxx11::string::~string((string *)&local_3d0);
      pcVar1 = this->Status;
      std::__cxx11::ostringstream::str();
      cmExecutionStatus::SetError(pcVar1,(string *)local_3f0);
      std::__cxx11::string::~string((string *)local_3f0);
      std::__cxx11::ostringstream::~ostringstream(local_3b0);
      return false;
    }
  }
  mStack_10 = match_properties.Permissions;
  if (mStack_10 == 0) {
    local_48c = this->FilePermissions;
  }
  else {
    local_48c = mStack_10;
  }
  local_3f4 = local_48c;
  if (local_48c == 0) {
    cmsys::SystemTools::GetPermissions(fromFile,&local_3f4);
  }
  bVar2 = SetPermissions(this,stack0xffffffffffffffd0,local_3f4);
  return bVar2;
}

Assistant:

bool cmFileCopier::InstallFile(const std::string& fromFile,
                               const std::string& toFile,
                               MatchProperties match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if (!this->Always) {
    // If both files exist with the same time do not copy.
    if (!this->FileTimes.DifferS(fromFile, toFile)) {
      copy = false;
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if (copy) {
    auto copy_status = cmSystemTools::CopyAFile(fromFile, toFile, true);
    if (!copy_status) {
      std::ostringstream e;
      e << this->Name << " cannot copy file \"" << fromFile << "\" to \""
        << toFile << "\": " << copy_status.GetString() << ".";
      this->Status.SetError(e.str());
      return false;
    }
  }

  // Set the file modification time of the destination file.
  if (copy && !this->Always) {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if (cmSystemTools::GetPermissions(toFile, perm)) {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
    }
    auto copy_status = cmFileTimes::Copy(fromFile, toFile);
    if (!copy_status) {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \"" << toFile
        << "\": " << copy_status.GetString() << ".";
      this->Status.SetError(e.str());
      return false;
    }
  }

  // Set permissions of the destination file.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->FilePermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
  }
  return this->SetPermissions(toFile, permissions);
}